

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentum
          (KinDynComputations *this,Span<double,__1L> spatial_momentum)

{
  long lVar1;
  pointer __dest;
  Index size;
  SrcEvaluatorType srcEvaluator;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  undefined8 local_98 [6];
  SpatialMomentum local_68;
  
  __dest = spatial_momentum.storage_.data_;
  if (spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalTotalMomentum(&local_68,this);
    local_98[0] = local_68._8_8_;
    local_98[1] = local_68._16_8_;
    local_98[2] = local_68._24_8_;
    local_98[3] = local_68._32_8_;
    local_98[4] = local_68._40_8_;
    local_98[5] = local_68._48_8_;
    uVar4 = 6;
    if ((((undefined1  [16])spatial_momentum.storage_ & (undefined1  [16])0x7) ==
         (undefined1  [16])0x0) && (uVar4 = (ulong)((uint)((ulong)__dest >> 3) & 1), 5 < uVar4)) {
      uVar4 = 6;
    }
    lVar2 = 6 - uVar4;
    if (uVar4 != 0) {
      memcpy(__dest,local_98,uVar4 * 8);
    }
    lVar3 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar4;
    if (1 < lVar2) {
      lVar1 = uVar4 + 2;
      if ((long)(uVar4 + 2) < lVar3) {
        lVar1 = lVar3;
      }
      memcpy(__dest + uVar4,local_98 + uVar4,(~uVar4 + lVar1 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (lVar3 < 6) {
      memcpy(__dest + (lVar2 / 2) * 2 + uVar4,local_98 + (lVar2 / 2) * 2 + uVar4,(6 - lVar3) * 8);
    }
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_68.super_SpatialForceVector);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentum",
               "Wrong size in input spatial_momentum");
  }
  return spatial_momentum.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentum(iDynTree::Span<double> spatial_momentum)
{
    constexpr int expected_spatial_momentum_size = 6;
    bool ok = spatial_momentum.size() == expected_spatial_momentum_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalTotalMomentum","Wrong size in input spatial_momentum");
        return false;
    }

    toEigen(spatial_momentum) = toEigen(getCentroidalTotalMomentum());

    return true;
}